

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

char __thiscall ConstantExpression::ToHex(ConstantExpression *this,int value)

{
  int value_local;
  ConstantExpression *this_local;
  
  if (value < 10) {
    this_local._7_1_ = (char)value + '0';
  }
  else if (value < 0x10) {
    this_local._7_1_ = (char)value + 'W';
  }
  else {
    this_local._7_1_ = '0';
  }
  return this_local._7_1_;
}

Assistant:

char ToHex( int value )
	{
		if (value < 10)
			return '0' + value;
		else if (value < 16)
			return 'a' + (value - 10);
		else
			return '0';
	}